

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkIsTopo(Abc_Ntk_t *pNtk)

{
  undefined4 uVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  int extraout_EDX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  ulong uVar7;
  ulong uVar8;
  ulong extraout_RDX_02;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar9 = pNtk->vObjs->nSize;
    uVar7 = (long)iVar9 + 500;
    iVar12 = (int)uVar7;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar5 = (int *)malloc(uVar7 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar12;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar9) {
      memset((pNtk->vTravIds).pArray,0,(uVar7 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar9 = pNtk->nTravIds;
  pNtk->nTravIds = iVar9 + 1;
  if (0x3ffffffe < iVar9) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      lVar11 = *pVVar6->pArray[lVar13];
      uVar1 = *(undefined4 *)(lVar11 + 0xd8);
      iVar9 = (int)*(long *)((long)pVVar6->pArray[lVar13] + 0x10);
      Vec_IntFillExtra((Vec_Int_t *)(lVar11 + 0xe0),iVar9 + 1,(int)in_RDX);
      if (((long)iVar9 < 0) || (*(int *)(lVar11 + 0xe4) <= iVar9)) goto LAB_00882506;
      *(undefined4 *)(*(long *)(lVar11 + 0xe8) + (long)iVar9 * 4) = uVar1;
      lVar13 = lVar13 + 1;
      pVVar6 = pNtk->vCis;
      in_RDX = extraout_RDX_01;
    } while (lVar13 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vObjs;
  if (pVVar6->nSize < 1) {
    uVar10 = 0;
  }
  else {
    lVar13 = 0;
    uVar7 = 0;
    do {
      plVar2 = (long *)pVVar6->pArray[lVar13];
      if ((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) {
        if (*(int *)((long)plVar2 + 0x1c) < 1) {
          iVar9 = 0;
        }
        else {
          lVar11 = 0;
          uVar8 = uVar7;
          do {
            plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)(plVar2[4] + lVar11 * 4) * 8);
            lVar4 = *plVar3;
            iVar9 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar9 + 1,(int)uVar8);
            if (((long)iVar9 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
          } while ((*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar9 * 4) == *(int *)(*plVar3 + 0xd8))
                  && (lVar11 = lVar11 + 1, uVar8 = extraout_RDX_02,
                     lVar11 < *(int *)((long)plVar2 + 0x1c)));
          iVar9 = (int)lVar11;
        }
        iVar12 = (int)uVar7;
        if ((iVar9 != *(int *)((long)plVar2 + 0x1c)) && (uVar7 = (ulong)(iVar12 + 1), iVar12 == 0))
        {
          printf("Node %d is out of topo order.\n",(ulong)*(uint *)(plVar2 + 2));
          iVar12 = extraout_EDX;
        }
        lVar11 = *plVar2;
        uVar1 = *(undefined4 *)(lVar11 + 0xd8);
        iVar9 = (int)plVar2[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar11 + 0xe0),iVar9 + 1,iVar12);
        if (((long)iVar9 < 0) || (*(int *)(lVar11 + 0xe4) <= iVar9)) {
LAB_00882506:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar11 + 0xe8) + (long)iVar9 * 4) = uVar1;
      }
      lVar13 = lVar13 + 1;
      pVVar6 = pNtk->vObjs;
      uVar10 = (uint)uVar7;
    } while (lVar13 < pVVar6->nSize);
  }
  if (uVar10 != 0) {
    printf("Topological order does not hold for %d internal nodes.\n",(ulong)uVar10);
  }
  return (int)(uVar10 == 0);
}

Assistant:

int Abc_NtkIsTopo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent(pObj);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check if fanins are in the topo order
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                break;
        if ( k != Abc_ObjFaninNum(pObj) )
        {
            if ( Counter++ == 0 )
                printf( "Node %d is out of topo order.\n", Abc_ObjId(pObj) );
        }
        Abc_NodeSetTravIdCurrent(pObj);
    }
    if ( Counter )
        printf( "Topological order does not hold for %d internal nodes.\n", Counter );
    return (int)(Counter == 0);
}